

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O0

Bool ParseCharEnc(TidyDocImpl *doc,TidyOptionImpl *option)

{
  Bool BVar1;
  uint uVar2;
  int encoding;
  bool bVar3;
  uint local_68;
  Bool local_64;
  tchar c;
  Bool validEncoding;
  int enc;
  uint i;
  tmbchar buf [64];
  TidyOptionImpl *option_local;
  TidyDocImpl *doc_local;
  
  buf._56_8_ = option;
  memset(&enc,0,0x40);
  validEncoding = no;
  local_68 = SkipWhite(&doc->config);
  while( true ) {
    bVar3 = false;
    if ((validEncoding < 0x3e) && (bVar3 = false, local_68 != 0xffffffff)) {
      BVar1 = prvTidyIsWhite(local_68);
      bVar3 = BVar1 == no;
    }
    if (!bVar3) break;
    uVar2 = prvTidyToLower(local_68);
    *(char *)((long)&enc + (ulong)validEncoding) = (char)uVar2;
    local_68 = AdvanceChar(&doc->config);
    validEncoding = validEncoding + yes;
  }
  *(undefined1 *)((long)&enc + (ulong)validEncoding) = 0;
  encoding = prvTidyCharEncodingId(doc,(ctmbstr)&enc);
  if (-1 < encoding) {
    prvTidySetOptionInt(doc,*(TidyOptionId *)buf._56_8_,(long)encoding);
  }
  else {
    prvTidyReportBadArgument(doc,*(ctmbstr *)(buf._56_8_ + 8));
  }
  local_64 = (Bool)(-1 < encoding);
  if ((local_64 != no) && (*(int *)buf._56_8_ == 8)) {
    prvTidyAdjustCharEncoding(doc,encoding);
  }
  return local_64;
}

Assistant:

Bool ParseCharEnc( TidyDocImpl* doc, const TidyOptionImpl* option )
{
    tmbchar buf[64] = {0};
    uint i = 0;
    int enc = ASCII;
    Bool validEncoding = yes;
    tchar c = SkipWhite( &doc->config );

    while ( i < sizeof(buf)-2 && c != EndOfStream && !TY_(IsWhite)(c) )
    {
        buf[i++] = (tmbchar) TY_(ToLower)( c );
        c = AdvanceChar( &doc->config );
    }
    buf[i] = 0;

    enc = TY_(CharEncodingId)( doc, buf );

    if ( enc < 0 )
    {
        validEncoding = no;
        TY_(ReportBadArgument)( doc, option->name );
    }
    else
        TY_(SetOptionInt)( doc, option->id, enc );

    if ( validEncoding && option->id == TidyCharEncoding )
        TY_(AdjustCharEncoding)( doc, enc );
    return validEncoding;
}